

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O3

void __thiscall
CVmObjFileName::restore_from_file
          (CVmObjFileName *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  long lVar1;
  void *pvVar2;
  uint16_t tmp;
  int iVar3;
  int iVar4;
  size_t sVar5;
  undefined4 extraout_var;
  char *buf;
  char *__s;
  undefined4 extraout_var_00;
  uint16_t tmp_1;
  ulong buflen;
  long *in_FS_OFFSET;
  char b_1 [2];
  char b [4];
  ushort local_1042;
  CVmObjFileName *local_1040;
  uint local_1038 [2];
  long local_1030;
  void *local_1028;
  __jmp_buf_tag local_1020 [20];
  __jmp_buf_tag *__env;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  CVmFile::read_bytes(fp,(char *)local_1038,4);
  if (local_1038[0] == 0) {
    local_1040 = this;
    G_err_frame::__tls_init();
    local_1030 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_1038;
    __env = local_1020;
    local_1038[0] = _setjmp(__env);
    if (local_1038[0] == 0) {
      CVmFile::read_bytes(fp,(char *)&local_1042,2);
      buflen = (ulong)local_1042;
      buf = lib_alloc_str(buflen + 1);
      CVmFile::read_bytes(fp,buf,buflen);
      buf[buflen] = '\0';
      __s = url_to_local(buf,buflen,1);
      sVar5 = strlen(__s);
      iVar3 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,sVar5 + 10,local_1040);
      __env = (__jmp_buf_tag *)CONCAT44(extraout_var_00,iVar3);
      *(undefined4 *)__env->__jmpbuf = 0;
      *(undefined2 *)((long)__env->__jmpbuf + 4) = 1;
      *(short *)((long)__env->__jmpbuf + 6) = (short)sVar5;
      *(undefined1 *)((long)__env->__jmpbuf + sVar5 + 8) = 0;
      if (__s == (char *)0x0) {
        __s = (char *)0x0;
      }
      else {
        memcpy(__env->__jmpbuf + 1,__s,sVar5);
      }
    }
    else {
      buf = (char *)0x0;
      __s = buf;
    }
    if (-1 < (short)local_1038[0]) {
      local_1038[0] = local_1038[0] | 0x8000;
      lib_free_str(__s);
      lib_free_str(buf);
    }
    lVar1 = local_1030;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar1;
    if ((local_1038[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar2 = local_1028;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
      err_rethrow();
    }
    this = local_1040;
    if ((local_1038[0] & 2) != 0) {
      free(local_1028);
      this = local_1040;
    }
  }
  else {
    iVar3 = CVmObjFile::sfid_to_path((char *)local_1038,0x1000,local_1038[0]);
    sVar5 = strlen((char *)local_1038);
    iVar4 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,sVar5 + 10,this);
    __env = (__jmp_buf_tag *)CONCAT44(extraout_var,iVar4);
    *(uint *)__env->__jmpbuf = local_1038[0];
    *(undefined2 *)((long)__env->__jmpbuf + 4) = 1;
    *(short *)((long)__env->__jmpbuf + 6) = (short)sVar5;
    *(undefined1 *)((long)__env->__jmpbuf + sVar5 + 8) = 0;
    memcpy(__env->__jmpbuf + 1,local_1038,sVar5);
    *(char *)((long)__env->__jmpbuf + 4) = (char)iVar3;
  }
  (this->super_CVmObject).ext_ = (char *)__env;
  return;
}

Assistant:

void CVmObjFileName::restore_from_file(VMG_ vm_obj_id_t self,
                                       CVmFile *fp, CVmObjFixup *fixups)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the special file ID */
    int32_t sfid = fp->read_int4();

    /* if there's a special file ID, look it up; otherwise read the name */
    vm_filnam_ext *ext;
    if (sfid != 0)
    {
        /* get the special file path */
        char sfbuf[OSFNMAX];
        int ok = CVmObjFile::sfid_to_path(vmg_ sfbuf, sizeof(sfbuf), sfid);

        /* create the extension */
        ext = vm_filnam_ext::alloc_ext(vmg_ this, sfid, sfbuf, strlen(sfbuf));

        /* note whether the ID is valid on this platform */
        ext->sfid_valid = (char)ok;
    }
    else
    {
        char *uni = 0, *lcl = 0;
        err_try
        {
            /* read the filename length */
            size_t len = fp->read_uint2();
            
            /* load the saved universal path */
            uni = lib_alloc_str(len + 1);
            fp->read_bytes(uni, len);
            uni[len] = '\0';
            
            /* convert the saved universal path to local notation */
            lcl = url_to_local(vmg_ uni, len, TRUE);
        
            /* allocate the extension structure */
            ext = vm_filnam_ext::alloc_ext(vmg_ this, 0, lcl, strlen(lcl));
        }
        err_finally
        {
            /* we're done with the allocated buffers */
            lib_free_str(lcl);
            lib_free_str(uni);
        }